

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableSpiSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
EnrichableSpiSimulationDataGenerator::OutputWord_CPHA1
          (EnrichableSpiSimulationDataGenerator *this,U64 mosi_data,U64 miso_data)

{
  SimulationChannelDescriptor *pSVar1;
  uint uVar2;
  U32 UVar3;
  bool bVar4;
  BitExtractor miso_bits;
  BitExtractor mosi_bits;
  BitExtractor local_40 [8];
  BitExtractor local_38 [8];
  
  BitExtractor::BitExtractor
            (local_38,mosi_data,this->mSettings->mShiftOrder,this->mSettings->mBitsPerTransfer);
  BitExtractor::BitExtractor
            (local_40,miso_data,this->mSettings->mShiftOrder,this->mSettings->mBitsPerTransfer);
  UVar3 = this->mSettings->mBitsPerTransfer;
  uVar2 = (int)this + 0x20;
  while (bVar4 = UVar3 != 0, UVar3 = UVar3 - 1, bVar4) {
    SimulationChannelDescriptor::Transition();
    pSVar1 = this->mMosi;
    if (pSVar1 != (SimulationChannelDescriptor *)0x0) {
      BitExtractor::GetNextBit();
      SimulationChannelDescriptor::TransitionIfNeeded((BitState)pSVar1);
    }
    pSVar1 = this->mMiso;
    if (pSVar1 != (SimulationChannelDescriptor *)0x0) {
      BitExtractor::GetNextBit();
      SimulationChannelDescriptor::TransitionIfNeeded((BitState)pSVar1);
    }
    ClockGenerator::AdvanceByHalfPeriod(0.5);
    SimulationChannelDescriptorGroup::AdvanceAll(uVar2);
    SimulationChannelDescriptor::Transition();
    ClockGenerator::AdvanceByHalfPeriod(0.5);
    SimulationChannelDescriptorGroup::AdvanceAll(uVar2);
  }
  if (this->mMosi != (SimulationChannelDescriptor *)0x0) {
    SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mMosi);
  }
  if (this->mMiso != (SimulationChannelDescriptor *)0x0) {
    SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mMiso);
  }
  ClockGenerator::AdvanceByHalfPeriod(2.0);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar2);
  BitExtractor::~BitExtractor(local_40);
  BitExtractor::~BitExtractor(local_38);
  return;
}

Assistant:

void EnrichableSpiSimulationDataGenerator::OutputWord_CPHA1( U64 mosi_data, U64 miso_data )
{
	BitExtractor mosi_bits( mosi_data, mSettings->mShiftOrder, mSettings->mBitsPerTransfer );
	BitExtractor miso_bits( miso_data, mSettings->mShiftOrder, mSettings->mBitsPerTransfer );

	U32 count = mSettings->mBitsPerTransfer;
	for( U32 i=0; i<count; i++ )
	{
		mClock->Transition();  //data invalid
		if( mMosi != NULL )
			mMosi->TransitionIfNeeded( mosi_bits.GetNextBit() );
		if( mMiso != NULL )
			mMiso->TransitionIfNeeded( miso_bits.GetNextBit() );

		mEnrichableSpiSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( .5 ) );
		mClock->Transition();  //data valid

		mEnrichableSpiSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( .5 ) );
	}

	if( mMosi != NULL )
		mMosi->TransitionIfNeeded( BIT_LOW );
	if( mMiso != NULL )
		mMiso->TransitionIfNeeded( BIT_LOW );

	mEnrichableSpiSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 2.0 ) );
}